

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

void __thiscall CVmRun::terminate(CVmRun *this)

{
  return;
}

Assistant:

void CVmRun::terminate()
{
    /*
     *   If we're including the profiler in the build, delete its memory
     *   structures.  
     */
#ifdef VM_PROFILER

    /* delete the profiler stack */
    if (prof_stack_ != 0)
    {
        t3free(prof_stack_);
        prof_stack_ = 0;
    }

    /* delete the profiler master hash table */
    if (prof_master_table_ != 0)
    {
        delete prof_master_table_;
        prof_master_table_ = 0;
    }

#endif /* VM_PROFILER */
}